

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void lambert_lighting(vec3f light_dir,Model *model,TGAImage *image)

{
  array<vec<3UL,_int>,_3UL> pts;
  pointer pdVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int j;
  size_t i;
  ulong iface;
  double dVar6;
  vec<3UL,_double> ret_1;
  vec<3UL,_double> ret;
  array<vec<3UL,_int>,_3UL> screen_coords;
  array<vec<3UL,_double>,_3UL> world_coords;
  double local_138 [4];
  double local_118 [3];
  TGAImage *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  int local_d8;
  vec3f local_c8;
  vec3f local_a8;
  vector<double,_std::allocator<double>_> local_90;
  vec<3UL,_double> local_78;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  local_100 = image;
  pdVar1 = (pointer)operator_new(0x2bf200);
  local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar1 + 360000;
  lVar3 = 0;
  do {
    pdVar1[lVar3] = -1.79769313486232e+308;
    (pdVar1 + lVar3)[1] = -1.79769313486232e+308;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 360000);
  iface = 0;
  local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar1;
  local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  while( true ) {
    sVar2 = Model::nfaces(model);
    if (sVar2 <= iface) break;
    local_e8 = 0;
    uStack_e0 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_d8 = 0;
    local_48 = 0.0;
    dStack_40 = 0.0;
    local_58 = 0.0;
    dStack_50 = 0.0;
    local_78.z = 0.0;
    dStack_60 = 0.0;
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_38 = 0.0;
    lVar3 = 0;
    sVar2 = 0;
    do {
      Model::vert(&local_a8,model,iface,sVar2);
      iVar5 = (int)local_a8.z;
      *(ulong *)((long)&local_f8 + lVar3) =
           CONCAT44((int)((local_a8.y + 1.0) * 600.0 * 0.5 + 0.5),
                    (int)((local_a8.x + 1.0) * 600.0 * 0.5 + 0.5));
      *(int *)((long)&uStack_f0 + lVar3) = iVar5;
      Model::vert(&local_c8,model,iface,sVar2);
      *(double *)((long)&local_78.z + lVar3 * 2) = local_c8.z;
      *(double *)((long)&local_78.x + lVar3 * 2) = local_c8.x;
      *(double *)((long)&local_78.y + lVar3 * 2) = local_c8.y;
      sVar2 = sVar2 + 1;
      lVar3 = lVar3 + 0xc;
    } while (sVar2 != 3);
    local_118[2] = local_38;
    local_118[0] = local_48;
    local_118[1] = dStack_40;
    lVar3 = 3;
    do {
      dVar6 = vec<3UL,_double>::operator[](&local_78,lVar3 - 1);
      lVar4 = 0;
      if (lVar3 != 1) {
        lVar4 = (ulong)(lVar3 != 2) * 8 + 8;
      }
      *(double *)((long)local_118 + lVar4) = *(double *)((long)local_118 + lVar4) - dVar6;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    local_138[2] = dStack_50;
    local_138[0] = dStack_60;
    local_138[1] = local_58;
    lVar3 = 3;
    do {
      dVar6 = vec<3UL,_double>::operator[](&local_78,lVar3 - 1);
      lVar4 = 0;
      if (lVar3 != 1) {
        lVar4 = (ulong)(lVar3 != 2) * 8 + 8;
      }
      *(double *)((long)local_138 + lVar4) = *(double *)((long)local_138 + lVar4) - dVar6;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    local_c8.x = local_138[2] * local_118[1] - local_118[2] * local_138[1];
    local_c8.y = local_138[0] * local_118[2] - local_118[0] * local_138[2];
    local_c8.z = local_118[0] * local_138[1] - local_138[0] * local_118[1];
    vec<3UL,_double>::normalize(&local_c8);
    dVar6 = dot<3ul,double>(&local_c8,&light_dir);
    if (0.0 < dVar6) {
      pts._M_elems[0].z = (undefined4)uStack_f0;
      pts._M_elems[1].x = uStack_f0._4_4_;
      pts._M_elems[0].x = (undefined4)local_f8;
      pts._M_elems[0].y = local_f8._4_4_;
      pts._M_elems[1].y = (undefined4)local_e8;
      pts._M_elems[1].z = local_e8._4_4_;
      pts._M_elems[2].x = (undefined4)uStack_e0;
      pts._M_elems[2].y = uStack_e0._4_4_;
      pts._M_elems[2].z = local_d8;
      triangle(pts,&local_90,local_100,
               (TGAColor)((uint5)((int)(dVar6 * 255.0) & 0xff) * 0x10101 | 0x4ff000000));
    }
    iface = iface + 1;
  }
  operator_delete(pdVar1,0x2bf200);
  return;
}

Assistant:

void lambert_lighting(vec3f light_dir, Model &model, TGAImage &image)
{
    std::vector<double> zbuffer(width * height, -std::numeric_limits<double>::max());
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::array<vec3i, 3> screen_coords;
        std::array<vec3f, 3> world_coords;
        for (int j = 0; j < 3; j++) {
            screen_coords[j] = world2screen(model.vert(i, j));
            world_coords[j] = model.vert(i, j);
        }
        vec3f n = cross(world_coords[2] - world_coords[0], world_coords[1] - world_coords[0]);
        n.normalize();
        double intensity = dot(n, light_dir);
        if (intensity > 0) {
            triangle(screen_coords, zbuffer, image,
                     TGAColor(static_cast<uint8_t>(intensity * 255),
                              static_cast<uint8_t>(intensity * 255),
                              static_cast<uint8_t>(intensity * 255), 255));
        }
    }
}